

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

features ** __thiscall
v_hashmap<substring,_features_*>::get
          (v_hashmap<substring,_features_*> *this,substring *key,uint64_t hash)

{
  bool bVar1;
  ulong uVar2;
  vw_exception *this_00;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  uVar2 = (*(long *)(this + 0x28) - *(long *)(this + 0x18)) / 0x28;
  uVar4 = hash % uVar2;
  *(ulong *)(this + 0x38) = uVar4;
  uVar3 = uVar4;
  do {
    if (*(char *)(*(long *)(this + 0x18) + uVar3 * 0x28) == '\0') {
      return (features **)(this + 0x10);
    }
    lVar5 = *(long *)(this + 0x18) + uVar3 * 0x28;
    if (*(uint64_t *)(lVar5 + 0x20) == hash) {
      bVar1 = is_equivalent(this,key,(substring *)(lVar5 + 8));
      uVar3 = *(ulong *)(this + 0x38);
      if (bVar1) {
        return (features **)(*(long *)(this + 0x18) + uVar3 * 0x28 + 0x18);
      }
    }
    uVar3 = uVar3 + 1;
    if (uVar2 <= uVar3) {
      uVar3 = 0;
    }
    *(ulong *)(this + 0x38) = uVar3;
  } while (uVar3 != uVar4);
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"error: v_hashmap did not grow enough!");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
             ,0xe2,&sStack_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

V& get(const K& key, uint64_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return default_value;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return dat[last_position].val;

      // there's something there that's NOT us -- advance pointer
      // cerr << "+";
      // num_linear_steps++;
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }